

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int luaG_checkopenop(Instruction i)

{
  int local_c;
  Instruction i_local;
  
  if (((i & 0x3f) - 0x1c < 3) || ((i & 0x3f) == 0x22)) {
    if (i >> 0x17 == 0) {
      local_c = 1;
    }
    else {
      local_c = 0;
    }
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int luaG_checkopenop (Instruction i) {
  switch (GET_OPCODE(i)) {
    case OP_CALL:
    case OP_TAILCALL:
    case OP_RETURN:
    case OP_SETLIST: {
      check(GETARG_B(i) == 0);
      return 1;
    }
    default: return 0;  /* invalid instruction after an open call */
  }
}